

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall
kratos::Simulator::set_complex_value_
          (Simulator *this,Var *var,
          optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *op_value)

{
  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  uint *puVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  void *pvVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  const_iterator __begin3;
  undefined4 extraout_var;
  iterator iVar9;
  mapped_type *pmVar10;
  uint *puVar11;
  iterator iVar12;
  iterator iVar13;
  InternalException *pIVar15;
  UserException *pUVar16;
  int iVar17;
  const_iterator __end3;
  ulong uVar18;
  long lVar19;
  size_type sVar20;
  int iVar21;
  size_type __n;
  long lVar22;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar23;
  optional<unsigned_long> op_value_00;
  undefined1 local_e8 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  undefined1 local_c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> value;
  Var *local_a0;
  Var *var_local;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  Var *local_78;
  Var *root;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  Var *fill_var;
  pointer puVar14;
  
  if ((op_value->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged == true) {
    local_a0 = var;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)op_value);
    puVar11 = (local_a0->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (local_a0->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)puVar1 - (long)puVar11 == 4) && (*puVar11 == 1)) {
      if (8 < (ulong)((long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)local_c0)) {
        pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
        root = (Var *)&changed_bits._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&root,"Cannot set multiple values to a scalar","");
        UserException::UserException(pUVar16,(string *)&root);
        __cxa_throw(pUVar16,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = 1;
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value =
           *(_Storage<unsigned_long,_true> *)local_c0;
      set_value_(this,local_a0,op_value_00);
    }
    else {
      var_local = (Var *)0x0;
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (local_a0->type_ == Slice) {
        iVar7 = (*(local_a0->super_IRNode)._vptr_IRNode[0x28])(local_a0);
        local_78 = (Var *)CONCAT44(extraout_var,iVar7);
        changed_bits._M_h._M_single_bucket = (__node_base_ptr)local_78;
        get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)local_e8,this,local_a0);
        if ((pointer)CONCAT44(local_e8._4_4_,local_e8._0_4_) ==
            index.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
          root = (Var *)&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>((string *)&root,"Empty slice","");
          InternalException::InternalException(pIVar15,(string *)&root);
          __cxa_throw(pIVar15,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)compute_var_high_low
                                (local_78,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                           *)local_e8);
        value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)index.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
        uVar8 = local_78->var_width_;
        if (((int)((ulong)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage % (ulong)uVar8) != 0) ||
           ((int)(((ulong)index.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff) %
                 (ulong)uVar8) != uVar8 - 1)) {
          pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
          root = (Var *)&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&root,"Misaligned vector slicing","");
          InternalException::InternalException(pIVar15,(string *)&root);
          __cxa_throw(pIVar15,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar11 = (local_78->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar1 = (local_78->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((long)puVar1 - (long)puVar11 == 4) && (*puVar11 == 1)) {
          iVar9 = std::
                  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)this,&local_78);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
              _M_cur == (__node_type *)0x0) {
            pmVar10 = std::__detail::
                      _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,&local_78);
            *pmVar10 = 0;
          }
          iVar9 = std::
                  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)this,&local_78);
          if (iVar9.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
              _M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          root = (Var *)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>
                               ._M_cur + 0x10);
          std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
          _M_assign_aux<unsigned_long*const*>
                    ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&var_local,&root);
          __n = 1;
        }
        else {
          __n = 1;
          for (; puVar11 != puVar1; puVar11 = puVar11 + 1) {
            __n = __n * *puVar11;
          }
          iVar12 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->complex_values_)._M_h,&local_78);
          if (iVar12.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                    ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&var_local,__n);
          if (__n == 0) {
            __n = 0;
          }
          else {
            lVar22 = 0;
            sVar20 = __n;
            do {
              root = (Var *)(*(long *)((long)iVar12.
                                             super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                             ._M_cur + 0x10) + lVar22);
              std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
              emplace_back<unsigned_long*>
                        ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&var_local,
                         (unsigned_long **)&root);
              lVar22 = lVar22 + 8;
              sVar20 = sVar20 - 1;
            } while (sVar20 != 0);
          }
        }
        pvVar5 = (void *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,(long)index.
                                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5);
        }
      }
      else {
        __n = 1;
        for (; puVar11 != puVar1; puVar11 = puVar11 + 1) {
          __n = __n * *puVar11;
        }
        changed_bits._M_h._M_single_bucket = (__node_base_ptr)local_a0;
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)((int)__n - 1);
        value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      this_00 = &this->complex_values_;
      iVar12 = std::
               _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&this_00->_M_h,(key_type *)&changed_bits._M_h._M_single_bucket);
      if ((iVar12.
           super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
           ._M_cur == (__node_type *)0x0) &&
         (iVar13 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,(key_type *)&changed_bits._M_h._M_single_bucket),
         iVar13.
         super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
         ._M_cur == (__node_type *)0x0)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&root,__n,
                   (allocator_type *)local_e8);
        if (__n != 0) {
          memset(root,0,__n * 8);
        }
        std::
        _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                  ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)this_00,&local_a0,&root);
        if (root != (Var *)0x0) {
          operator_delete(root,changed_bits._M_h._M_bucket_count - (long)root);
        }
      }
      if (local_a0->type_ != Slice) {
        std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                  ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&var_local,__n);
        iVar13 = std::
                 _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&this_00->_M_h,&local_a0);
        if (iVar13.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        if (__n != 0) {
          lVar22 = 0;
          do {
            root = (Var *)(*(long *)((long)iVar13.
                                           super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                           ._M_cur + 0x10) + lVar22);
            std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                      ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&var_local,
                       (unsigned_long **)&root);
            lVar22 = lVar22 + 8;
            __n = __n - 1;
          } while (__n != 0);
        }
      }
      if ((long)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl
                .super__Vector_impl_data._M_start - (long)var_local !=
          (long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_c0) {
        cVar6 = (*(code *)(changed_bits._M_h._M_single_bucket)->_M_nxt[0x18]._M_nxt)();
        if (cVar6 == '\0') {
          pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
          root = (Var *)&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>((string *)&root,"Misaligned slicing","");
          UserException::UserException(pUVar16,(string *)&root);
          __cxa_throw(pUVar16,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (8 < (ulong)((long)value.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)local_c0)) {
          pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
          root = (Var *)&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&root,"Multiple value assigned to packed array not supported","");
          InternalException::InternalException(pIVar15,(string *)&root);
          __cxa_throw(pIVar15,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar18 = *(ulong *)local_c0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&root,
                   (long)values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)var_local >> 3,
                   (allocator_type *)local_e8);
        if ((long)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)var_local != 0) {
          iVar7 = *(int *)&changed_bits._M_h._M_single_bucket[0x13]._M_nxt;
          lVar22 = (long)values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)var_local >> 3;
          iVar17 = 0;
          lVar19 = 0;
          do {
            (&(root->super_IRNode)._vptr_IRNode)[lVar19] =
                 (_func_int **)(uVar18 >> ((byte)iVar17 & 0x3f) & ~(-1L << ((byte)iVar7 & 0x3f)));
            lVar19 = lVar19 + 1;
            iVar17 = iVar17 + iVar7;
          } while (lVar22 + (ulong)(lVar22 == 0) != lVar19);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&root);
        if (root != (Var *)0x0) {
          operator_delete(root,changed_bits._M_h._M_bucket_count - (long)root);
        }
      }
      root = (Var *)&changed_bits._M_h._M_rehash_policy._M_next_resize;
      changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
      changed_bits._M_h._M_bucket_count = 0;
      changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
      changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      changed_bits._M_h._M_rehash_policy._4_4_ = 0;
      changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
      if ((uint)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage <=
          (uint)index.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        iVar7 = *(int *)&changed_bits._M_h._M_single_bucket[0x13]._M_nxt;
        iVar17 = (uint)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage * iVar7;
        puVar14 = value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        do {
          uVar18 = (ulong)puVar14 & 0xffffffff;
          pp_Var2 = (&(var_local->super_IRNode)._vptr_IRNode)[uVar18];
          p_Var3 = *pp_Var2;
          p_Var4 = (_func_int *)
                   ((_Storage<unsigned_long,_true> *)((long)local_c0 + uVar18 * 8))->_M_value;
          value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar14;
          if (((iVar12.
                super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                ._M_cur == (__node_type *)0x0) || (p_Var3 != p_Var4)) &&
             (*pp_Var2 = p_Var4, iVar7 != 0)) {
            iVar21 = 0;
            do {
              if ((iVar12.
                   super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                   ._M_cur == (__node_type *)0x0) ||
                 ((1 << ((byte)iVar21 & 0x1f) & ((uint)p_Var4 ^ (uint)p_Var3)) != 0)) {
                local_e8._0_4_ = iVar17 + iVar21;
                pVar23 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::_M_emplace<unsigned_int>
                                   ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                     *)&root,local_e8,uVar18);
                uVar18 = pVar23._8_8_;
              }
              iVar21 = iVar21 + 1;
            } while (iVar7 != iVar21);
          }
          uVar8 = (int)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
          puVar14 = (pointer)(ulong)uVar8;
          iVar17 = iVar17 + iVar7;
        } while (uVar8 <= (uint)index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      trigger_event(this,(Var *)changed_bits._M_h._M_single_bucket,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&root);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&root);
      if (var_local != (Var *)0x0) {
        operator_delete(var_local,
                        (long)values.
                              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)var_local);
      }
    }
    if (local_c0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_c0,
                      (long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_c0);
    }
  }
  return;
}

Assistant:

void Simulator::set_complex_value_(const kratos::Var *var,
                                   const std::optional<std::vector<uint64_t>> &op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() == 1 && var->size().front() == 1) {
        if (value.size() > 1) throw UserException("Cannot set multiple values to a scalar");
        set_value_(var, value[0]);
        return;
    }
    std::vector<uint64_t *> values;
    uint64_t base = 1;
    const Var *fill_var;
    uint32_t low, high;
    if (var->type() == VarType::Slice) {
        const auto *root = var->get_var_root_parent();
        fill_var = root;
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_low % root->var_width() != 0 ||
            (var_high % root->var_width() != root->var_width() - 1))
            throw InternalException("Misaligned vector slicing");
        low = var_low;
        high = var_high;
        if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            for (uint32_t s : root->size()) {
                base *= s;
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
    } else {
        for (uint32_t s : var->size()) {
            base *= s;
        }
        fill_var = var;
        low = 0;
        high = base - 1;
    }
    bool fill_in = false;
    if (complex_values_.find(fill_var) == complex_values_.end()) {
        // whatever bits changed
        // fill in values
        fill_in = true;
        if (complex_values_.find(fill_var) == complex_values_.end()) {
            // fill in values
            std::vector<uint64_t> v(base);
            for (uint64_t i = 0; i < base; i++) v[i] = 0;
            complex_values_.emplace(var, v);
        }
    }

    // get values
    if (var->type() != VarType::Slice) {
        values.reserve(base);
        auto &v_ref = complex_values_.at(var);
        for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
    }

    if (values.size() != value.size()) {
        // expand the value to if the target is packed
        if (fill_var->is_packed()) {
            if (value.size() > 1) {
                throw InternalException("Multiple value assigned to packed array not supported");
            }
            auto v = value[0];
            std::vector<uint64_t> v_(values.size());
            for (uint64_t i = 0; i < values.size(); i++) {
                auto w = fill_var->var_width();
                v_[i] = (v >> (w * i)) & (~(UINT64_MASK << w));
            }
            value = v_;
        } else {
            throw UserException("Misaligned slicing");
        }
    }
    std::unordered_set<uint32_t> changed_bits;
    uint32_t var_width = fill_var->var_width();

    for (uint32_t i = low; i <= high; i++) {
        if (*(values[i]) != value[i] || fill_in) {
            uint32_t bit_mask = (*values[i]) ^ value[i];
            *(values[i]) = value[i];
            for (uint32_t bit = 0; bit < var_width; bit++) {
                if ((bit_mask >> bit) & 1u || fill_in) {
                    changed_bits.emplace(bit + var_width * i);
                }
            }
        }
    }
    trigger_event(fill_var, changed_bits);
}